

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cg.hpp
# Opt level: O2

VecDoub * __thiscall
Frprmn<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
::minimize(VecDoub *__return_storage_ptr__,
          Frprmn<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
          *this,VecDoub_I *pp)

{
  VecDoub *this_00;
  double dVar1;
  pointer pdVar2;
  int iVar3;
  ostream *poVar4;
  General_Exception *this_01;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  size_type __n;
  double dVar8;
  Doub DVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  string local_c0;
  undefined1 local_a0 [8];
  VecDoub g;
  VecDoub h;
  double local_68;
  allocator local_31;
  
  dVar1 = (this->
          super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
          ).ftol;
  uVar5 = (ulong)((long)(pp->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(pp->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)this,pp);
  iVar3 = (int)uVar5;
  __n = (size_type)iVar3;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_a0,__n,(allocator_type *)&local_c0);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &g.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,__n,(allocator_type *)&local_c0);
  this_00 = &(this->
             super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
             ).xi;
  std::vector<double,_std::allocator<double>_>::resize(this_00,__n);
  local_68 = LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>
             ::operator()((this->
                          super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
                          ).func,(vector<double,_std::allocator<double>_> *)this);
  LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>
  ::df((this->
       super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
       ).func,(vector<double,_std::allocator<double>_> *)this,this_00);
  pdVar2 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = 0;
  uVar5 = uVar5 & 0xffffffff;
  if (iVar3 < 1) {
    uVar5 = uVar6;
  }
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    dVar8 = -pdVar2[uVar6];
    *(double *)((long)local_a0 + uVar6 * 8) = dVar8;
    g.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage[uVar6] = dVar8;
    pdVar2[uVar6] = dVar8;
  }
  uVar6 = 0;
  while( true ) {
    iVar3 = (int)uVar6;
    if (iVar3 == 2000000000) {
      this_01 = (General_Exception *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&local_c0,"Too many iterations in frprmn",&local_31);
      General_Exception::General_Exception(this_01,&local_c0);
      __cxa_throw(this_01,&General_Exception::typeinfo,General_Exception::~General_Exception);
    }
    if ((int)(uVar6 % 100) == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"#At iteration: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
      std::operator<<(poVar4," states are:\n");
      *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 0x11;
      for (uVar7 = 0;
          (ulong)uVar7 <
          (ulong)((long)(this->
                        super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
                        ).p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(this->
                        super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
                        ).p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3); uVar7 = uVar7 + 1) {
        poVar4 = std::operator<<((ostream *)&std::cout,"#\t");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::operator<<(poVar4,"\t");
        poVar4 = std::ostream::_M_insert<double>
                           ((this->
                            super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
                            ).p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar7]);
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      std::ostream::flush();
    }
    this->iter = iVar3;
    DVar9 = Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
            ::linmin(&this->
                      super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
                    );
    this->fret = DVar9;
    if (ABS(DVar9 - local_68) + ABS(DVar9 - local_68) <=
        (ABS(local_68) + ABS(DVar9) + 2.220446049250313e-16) *
        (this->
        super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
        ).ftol) {
      *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 0x11;
      poVar4 = std::operator<<((ostream *)&std::cout,"#Convergence met at iteration ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
      poVar4 = std::operator<<(poVar4,
                               " because the relative difference in F(p) between 2 consecutive iteration is smaller than "
                              );
      *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
           *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xfffffefb | 0x100;
      poVar4 = std::ostream::_M_insert<double>
                         ((this->
                          super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
                          ).ftol);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::vector<double,_std::allocator<double>_>::vector
                (__return_storage_ptr__,(vector<double,_std::allocator<double>_> *)this);
      goto LAB_001348be;
    }
    LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>
    ::df((this->
         super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
         ).func,(vector<double,_std::allocator<double>_> *)this,this_00);
    dVar8 = 1.0;
    if (1.0 <= DVar9) {
      dVar8 = DVar9;
    }
    pdVar2 = (this->
             super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
             ).xi.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar10 = 0.0;
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      dVar11 = ABS((this->
                   super_Dlinemethod<LikeliHoodFunc<DensityOfState<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>,_ftree<double>_>_>
                   ).p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar6]);
      dVar12 = 1.0;
      if (1.0 <= dVar11) {
        dVar12 = dVar11;
      }
      dVar12 = (dVar12 * ABS(pdVar2[uVar6])) / dVar8;
      if (dVar12 <= dVar10) {
        dVar12 = dVar10;
      }
      dVar10 = dVar12;
    }
    if (dVar10 < dVar1) break;
    dVar8 = 0.0;
    dVar10 = 0.0;
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      dVar12 = *(double *)((long)local_a0 + uVar6 * 8);
      dVar10 = dVar10 + dVar12 * dVar12;
      dVar8 = dVar8 + (dVar12 + pdVar2[uVar6]) * pdVar2[uVar6];
    }
    if ((dVar10 == 0.0) && (!NAN(dVar10))) {
      poVar4 = std::operator<<((ostream *)&std::cout,"#Convergence met at iteration ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
      poVar4 = std::operator<<(poVar4," because the search direction vector is exactly zero");
      goto LAB_001348ab;
    }
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      dVar12 = pdVar2[uVar6];
      *(double *)((long)local_a0 + uVar6 * 8) = -dVar12;
      dVar12 = g.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
               ._M_end_of_storage[uVar6] * (dVar8 / dVar10) - dVar12;
      g.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage[uVar6] = dVar12;
      pdVar2[uVar6] = dVar12;
    }
    uVar6 = (ulong)(iVar3 + 1);
    local_68 = DVar9;
  }
  *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 0x11;
  poVar4 = std::operator<<((ostream *)&std::cout,"#Convergence met at iteration ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  std::operator<<(poVar4," because gradient is smaller than ");
  poVar4 = std::ostream::_M_insert<double>(dVar1);
LAB_001348ab:
  std::endl<char,std::char_traits<char>>(poVar4);
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,(vector<double,_std::allocator<double>_> *)this);
LAB_001348be:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)
             &g.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)local_a0);
  return __return_storage_ptr__;
}

Assistant:

VecDoub minimize(VecDoub_I &pp)
	{
		const Int ITMAX=2000000000;
		const Doub EPS=numeric_limits<Doub>::epsilon();
		const Doub GTOL=ftol;
		Doub gg,dgg;
		Int n=pp.size();
		p=pp;
		VecDoub g(n),h(n);
		xi.resize(n);
		Doub fp=func(p);
		func.df(p,xi);
		for (Int j=0;j<n;j++) {
			g[j] = -xi[j];
			xi[j]=h[j]=g[j];
		}
		for (Int its=0;its<ITMAX;its++) {
		        if(!(its % 100)) {
			  cout << "#At iteration: " << its << " states are:\n";
			  cout.precision(VALMAXDIGITS10); 
			  for(uint i = 0; i < p.size(); ++i) cout << "#\t" << i << "\t" << p[i] << endl;
			  cout.flush();
			}
			iter=its;
			fret=linmin();
			if (2.0*abs(fret-fp) <= ftol*(abs(fret)+abs(fp)+EPS)) {
			  cout.precision(VALMAXDIGITS10);
			  cout << "#Convergence met at iteration " << its << " because the relative difference in F(p) between 2 consecutive iteration is smaller than " << scientific << ftol << endl;
				return p;
			}
			fp=fret;
			func.df(p,xi);
			Doub test=0.0;
			Doub den=MAX(fp, Doub{1.0});
			for (Int j=0;j<n;j++) {
				Doub temp=abs(xi[j])*MAX(abs(p[j]),Doub{1.0})/den;
				if (temp > test) test=temp;
			}
			if (test < GTOL) { 
			  cout.precision(VALMAXDIGITS10); 
			  cout << "#Convergence met at iteration " << its << " because gradient is smaller than " << GTOL << endl;
			  return p;
			}
			dgg=gg=0.0;
			for (Int j=0;j<n;j++) {
				gg += g[j]*g[j];
//			  dgg += xi[j]*xi[j];
				dgg += (xi[j]+g[j])*xi[j];
			}
			if (gg == 0.0) {
			  cout << "#Convergence met at iteration " << its << " because the search direction vector is exactly zero" << endl;
			  return p;
			}
			Doub gam=dgg/gg;
			for (Int j=0;j<n;j++) {
				g[j] = -xi[j];
				xi[j]=h[j]=g[j]+gam*h[j];
			}
		}
		throw(General_Exception("Too many iterations in frprmn"));
	}